

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_DoublingFactorCounterTest_FourQuads_TestShell::createTest
          (TEST_DoublingFactorCounterTest_FourQuads_TestShell *this)

{
  TEST_DoublingFactorCounterTest_FourQuads_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_FourQuads_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x35a);
  TEST_DoublingFactorCounterTest_FourQuads_Test::TEST_DoublingFactorCounterTest_FourQuads_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, FourQuads)
{
	addPair(Tile::WestWind);
	addQuad(Tile::ThreeOfCharacters, false);
	addQuad(Tile::FourOfCircles, true);
	addQuad(Tile::FiveOfBamboos, true);
	addQuad(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::FourQuads));
	CHECK_EQUAL(100, r.doubling_factor);
}